

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::InsideExpressionSyntax::getChild(InsideExpressionSyntax *this,size_t index)

{
  Token token;
  long in_RDX;
  ConstTokenOrSyntax *in_RSI;
  Info *in_RDI;
  SyntaxNode *in_stack_ffffffffffffffb8;
  Info *pIVar1;
  
  pIVar1 = in_RDI;
  if (in_RDX == 0) {
    not_null<slang::syntax::ExpressionSyntax_*>::get
              ((not_null<slang::syntax::ExpressionSyntax_*> *)(in_RSI + 1));
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)in_RDI,in_stack_ffffffffffffffb8);
  }
  else if (in_RDX == 1) {
    token.info = in_RDI;
    token._0_8_ = in_stack_ffffffffffffffb8;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x3a2e85,token);
    pIVar1 = in_RDI;
  }
  else if (in_RDX == 2) {
    not_null<slang::syntax::RangeListSyntax_*>::get
              ((not_null<slang::syntax::RangeListSyntax_*> *)(in_RSI + 2));
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)in_RDI,in_stack_ffffffffffffffb8);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_RSI,in_RDI);
    pIVar1 = in_RDI;
  }
  return (ConstTokenOrSyntax *)pIVar1;
}

Assistant:

ConstTokenOrSyntax InsideExpressionSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return expr.get();
        case 1: return inside;
        case 2: return ranges.get();
        default: return nullptr;
    }
}